

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

void __thiscall QGraphicsWidget::initStyleOption(QGraphicsWidget *this,QStyleOption *option)

{
  QGraphicsItem *this_00;
  byte *pbVar1;
  QPalettePrivate *pQVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  QGraphicsWidget *pQVar7;
  ColorGroup CVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  QFont fnt;
  undefined8 local_50;
  undefined1 local_48 [16];
  double local_38;
  double local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  this_00 = (QGraphicsItem *)(this + 0x10);
  bVar6 = QGraphicsItem::isEnabled(this_00);
  if (bVar6) {
    *(byte *)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
               super_QFlagsStorage<QStyle::StateFlag>.i | 1;
  }
  bVar6 = QGraphicsItem::hasFocus(this_00);
  if (bVar6) {
    pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  bVar6 = QGraphicsItem::isUnderMouse(this_00);
  if (bVar6) {
    pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  pQVar7 = QGraphicsItem::window(this_00);
  if (pQVar7 != (QGraphicsWidget *)0x0) {
    bVar6 = QGraphicsItem::isActive(&(pQVar7->super_QGraphicsObject).super_QGraphicsItem);
    if (bVar6) {
      pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 2);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  bVar6 = QGraphicsItem::isWindow(this_00);
  if (bVar6) {
    pbVar1 = (byte *)((long)&(option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  option->direction = *(uint *)(*(long *)(this + 0x18) + 0x1b4) >> 1 & RightToLeft;
  QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(this + 0x20));
  dVar10 = (double)((ulong)(local_38 + 0.0) & 0x8000000000000000 | 0x3fe0000000000000) +
           local_38 + 0.0;
  bVar6 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  dVar9 = (double)((ulong)(local_30 + 0.0) & 0x8000000000000000 | 0x3fe0000000000000) +
          local_30 + 0.0;
  bVar5 = 2147483647.0 < dVar9;
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  (option->rect).x1 = 0;
  (option->rect).y1 = 0;
  (option->rect).x2 =
       (Representation)
       ((int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar10) + -1);
  (option->rect).y2 =
       (Representation)
       ((int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar9) + -1);
  QPalette::QPalette((QPalette *)local_48,(QPalette *)(*(long *)(this + 0x18) + 0x188));
  CVar8 = (option->palette).currentGroup;
  (option->palette).currentGroup = local_48._8_4_;
  local_48._8_4_ = CVar8;
  pQVar2 = (option->palette).d;
  (option->palette).d = (QPalettePrivate *)local_48._0_8_;
  local_48._0_8_ = pQVar2;
  QPalette::~QPalette((QPalette *)local_48);
  bVar6 = QGraphicsItem::isEnabled(this_00);
  CVar8 = Disabled;
  if (bVar6) {
    bVar6 = QGraphicsItem::isActive(this_00);
    CVar8 = (uint)!bVar6 * 2;
  }
  (option->palette).currentGroup = CVar8;
  lVar3 = *(long *)(this + 0x18);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)local_48,(QFont *)(lVar3 + 0x1a0));
  local_48._8_4_ = local_48._8_4_ | *(ColorGroup *)(lVar3 + 0x1b0);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_50,(QFont *)local_48);
  uVar4 = *(undefined8 *)&option->fontMetrics;
  *(undefined8 *)&option->fontMetrics = local_50;
  local_50 = uVar4;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_50);
  QFont::~QFont((QFont *)local_48);
  option->styleObject = (QObject *)this;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::initStyleOption(QStyleOption *option) const
{
    Q_ASSERT(option);

    option->state = QStyle::State_None;
    if (isEnabled())
        option->state |= QStyle::State_Enabled;
    if (hasFocus())
        option->state |= QStyle::State_HasFocus;
    // if (window->testAttribute(Qt::WA_KeyboardFocusChange)) // ### Window
    //     option->state |= QStyle::State_KeyboardFocusChange;
    if (isUnderMouse())
        option->state |= QStyle::State_MouseOver;
    if (QGraphicsWidget *w = window()) {
        if (w->isActiveWindow())
            option->state |= QStyle::State_Active;
    }
    if (isWindow())
        option->state |= QStyle::State_Window;
    /*
      ###
#ifdef QT_KEYPAD_NAVIGATION
    if (widget->hasEditFocus())
        state |= QStyle::State_HasEditFocus;
#endif
    */
    option->direction = layoutDirection();
    option->rect = rect().toRect(); // ### truncation!
    option->palette = palette();
    if (!isEnabled()) {
        option->palette.setCurrentColorGroup(QPalette::Disabled);
    } else if (isActiveWindow()) {
        option->palette.setCurrentColorGroup(QPalette::Active);
    } else {
        option->palette.setCurrentColorGroup(QPalette::Inactive);
    }
    option->fontMetrics = QFontMetrics(font());
    option->styleObject = const_cast<QGraphicsWidget *>(this);
}